

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

int __thiscall
picojson::
input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::getc(input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *this,FILE *__stream)

{
  bool bVar1;
  reference pcVar2;
  byte *pbVar3;
  input<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_local;
  
  if ((this->consumed_ & 1U) != 0) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&this->cur_);
    if (*pcVar2 == '\n') {
      this->line_ = this->line_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&this->cur_);
  }
  bVar1 = __gnu_cxx::operator==(&this->cur_,&this->end_);
  if (bVar1) {
    this->consumed_ = false;
    this_local._4_4_ = 0xffffffff;
  }
  else {
    this->consumed_ = true;
    pbVar3 = (byte *)__gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator*(&this->cur_);
    this_local._4_4_ = (uint)*pbVar3;
  }
  return this_local._4_4_;
}

Assistant:

int getc() {
    if (consumed_) {
      if (*cur_ == '\n') {
        ++line_;
      }
      ++cur_;
    }
    if (cur_ == end_) {
      consumed_ = false;
      return -1;
    }
    consumed_ = true;
    return *cur_ & 0xff;
  }